

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# allocator.c
# Opt level: O3

apx_error_t apx_allocator_create(apx_allocator_t *self,uint16_t maxPendingMessages)

{
  adt_buf_err_t aVar1;
  apx_error_t aVar2;
  
  if (self == (apx_allocator_t *)0x0) {
    aVar2 = 1;
  }
  else {
    aVar1 = adt_rbfh_createEx(&self->messages,'\x10',10,maxPendingMessages);
    aVar2 = 2;
    if (aVar1 == '\0') {
      self->workerThread = 0;
      aVar2 = 0;
      self->workerThreadValid = false;
      pthread_spin_init(&self->lock,0);
      sem_init((sem_t *)&self->semaphore,0,0);
      self->isRunning = false;
      soa_init(&self->soa);
    }
  }
  return aVar2;
}

Assistant:

apx_error_t apx_allocator_create(apx_allocator_t *self, uint16_t maxPendingMessages)
{
   if (self != 0)
   {
      size_t elemSize = sizeof(rbf_data_t);
      adt_buf_err_t bufResult;

      bufResult = adt_rbfh_createEx(&self->messages, (uint8_t) elemSize, ADT_RBFSH_MIN_NUM_ELEMS_DEFAULT, maxPendingMessages);
      if (bufResult != BUF_E_OK)
      {
         return APX_MEM_ERROR;
      }

#ifdef _WIN32
      self->workerThread = INVALID_HANDLE_VALUE;
#else
      self->workerThread = 0;
#endif
      self->workerThreadValid=false;
      SPINLOCK_INIT(self->lock);
#ifndef UNIT_TEST
      SEMAPHORE_CREATE(self->semaphore);
#endif
      self->isRunning = false;
      soa_init(&self->soa);
      return APX_NO_ERROR;
   }
   return APX_INVALID_ARGUMENT_ERROR;
}